

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
duckdb::make_uniq_base<duckdb::QueryNode,duckdb::RecursiveCTENode>(void)

{
  QueryNode *this;
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> in_RDI;
  
  this = (QueryNode *)operator_new(0xe0);
  QueryNode::QueryNode(this,RECURSIVE_CTE_NODE);
  this->_vptr_QueryNode = (_func_int **)&PTR__RecursiveCTENode_01981938;
  this[1]._vptr_QueryNode = (_func_int **)&this[1].modifiers;
  *(undefined8 *)&this[1].type = 0;
  *(undefined1 *)
   &this[1].modifiers.
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  this[1].cte_map.map.map.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&this[1].cte_map.map.map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&this[1].cte_map.map.map.
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,_std::default_delete<duckdb::CommonTableExpressionInfo>,_true>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  this[1].cte_map.map.map_idx._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].cte_map.map.map_idx._M_h._M_bucket_count = 0;
  this[1].cte_map.map.map_idx._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this[1].cte_map.map.map_idx._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].cte_map.map.map_idx._M_h._M_rehash_policy = 0;
  *(QueryNode **)
   in_RDI._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
   _M_t.super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
   super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = this;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (__uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<S> make_uniq_base(ARGS &&... args) { // NOLINT: mimic std style
	return unique_ptr<S>(new T(std::forward<ARGS>(args)...));
}